

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNodePtr xmlStringLenGetNodeList(xmlDoc *doc,xmlChar *value,int len)

{
  byte bVar1;
  int iVar2;
  xmlBufPtr buf;
  xmlEntityPtr pxVar3;
  _xmlNode *p_Var4;
  xmlChar *pxVar5;
  xmlNodePtr pxVar6;
  xmlNodePtr pxVar7;
  xmlChar *pxVar8;
  byte bVar9;
  byte *pbVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte *pbVar13;
  long lVar14;
  bool bVar15;
  xmlChar buffer [10];
  xmlNodePtr local_70;
  xmlNodePtr local_60;
  xmlChar local_3a [10];
  
  if (value == (xmlChar *)0x0) {
    local_70 = (xmlNodePtr)0x0;
  }
  else {
    local_70 = (xmlNodePtr)0x0;
    buf = xmlBufCreateSize(0);
    if (buf != (xmlBufPtr)0x0) {
      xmlBufSetAllocationScheme(buf,XML_BUFFER_ALLOC_DOUBLEIT);
      pbVar12 = value;
      if (len < 1) {
        local_60 = (xmlNodePtr)0x0;
        local_70 = (xmlNodePtr)0x0;
      }
      else {
        pbVar10 = value + len;
        local_70 = (xmlNodePtr)0x0;
        local_60 = (xmlNodePtr)0x0;
        pbVar11 = value;
        do {
          value = pbVar11;
          if (*pbVar11 == 0x26) {
            if ((pbVar11 == pbVar12) ||
               (iVar2 = xmlBufAdd(buf,pbVar12,(int)pbVar11 - (int)pbVar12), iVar2 == 0)) {
              pbVar13 = pbVar11 + 2;
              if ((pbVar13 < pbVar10) && ((pbVar11[1] == 0x23 && (*pbVar13 == 0x78)))) {
                pbVar12 = pbVar11 + 3;
                iVar2 = 0;
                bVar1 = 0;
                if (pbVar12 < pbVar10) {
                  bVar1 = *pbVar12;
                }
                bVar15 = bVar1 == 0x3b;
                if (!bVar15) {
                  pbVar11 = pbVar11 + 4;
                  iVar2 = 0;
                  do {
                    if ((byte)(bVar1 - 0x30) < 10) {
                      iVar2 = iVar2 * 0x10 + (uint)bVar1 + -0x30;
                    }
                    else if ((byte)(bVar1 + 0x9f) < 6) {
                      iVar2 = iVar2 * 0x10 + (uint)bVar1 + -0x57;
                    }
                    else {
                      if (5 < (byte)(bVar1 + 0xbf)) {
                        iVar2 = 0;
                        __xmlSimpleError(2,0x514,(xmlNodePtr)doc,
                                         "invalid hexadecimal character value\n",(char *)0x0);
                        break;
                      }
                      iVar2 = iVar2 * 0x10 + (uint)bVar1 + -0x37;
                    }
                    if (pbVar11 < pbVar10) {
                      bVar1 = *pbVar11;
                    }
                    else {
                      bVar1 = 0;
                    }
                    pbVar11 = pbVar11 + 1;
                    bVar15 = bVar1 == 0x3b;
                  } while (!bVar15);
                  pbVar12 = pbVar11 + -1;
                }
                value = pbVar12 + bVar15;
              }
              else {
                pbVar12 = pbVar11 + 1;
                if ((pbVar10 <= pbVar12) || (*pbVar12 != 0x23)) {
                  value = pbVar11 + 1;
                  bVar15 = value < pbVar10;
                  if (bVar15) {
                    lVar14 = 0;
LAB_00182ced:
                    if ((*value != 0) && (*value != 0x3b)) goto code_r0x00182cfa;
                    if ((bVar15) && (*value != 0)) {
                      if (lVar14 == 0) goto LAB_00182eed;
                      pxVar8 = xmlStrndup(pbVar12,-(int)lVar14);
                      pxVar3 = xmlGetDocEntity(doc,pxVar8);
                      if ((pxVar3 == (xmlEntityPtr)0x0) ||
                         (pxVar3->etype != XML_INTERNAL_PREDEFINED_ENTITY)) {
                        iVar2 = xmlBufIsEmpty(buf);
                        pxVar6 = local_70;
                        pxVar7 = local_60;
                        if (iVar2 != 0) {
LAB_00182d9e:
                          local_60 = pxVar7;
                          local_70 = pxVar6;
                          pxVar6 = xmlNewReference(doc,pxVar8);
                          if (pxVar6 == (xmlNodePtr)0x0) goto LAB_00182eb6;
                          if ((pxVar3 != (xmlEntityPtr)0x0) && (pxVar3->children == (_xmlNode *)0x0)
                             ) {
                            pxVar3->children = (_xmlNode *)0xffffffffffffffff;
                            pxVar7 = xmlStringGetNodeList(doc,pxVar6->content);
                            pxVar3->children = pxVar7;
                            pxVar3->owner = 1;
                            if (pxVar7 != (xmlNodePtr)0x0) {
                              do {
                                p_Var4 = pxVar7;
                                p_Var4->parent = (_xmlNode *)pxVar3;
                                pxVar7 = p_Var4->next;
                              } while (p_Var4->next != (_xmlNode *)0x0);
                              pxVar3->last = p_Var4;
                            }
                          }
                          pxVar7 = pxVar6;
                          if (local_60 != (xmlNodePtr)0x0) {
                            pxVar7 = xmlAddNextSibling(local_60,pxVar6);
                            pxVar6 = local_70;
                          }
LAB_00182eda:
                          local_60 = pxVar7;
                          (*xmlFree)(pxVar8);
                          local_70 = pxVar6;
LAB_00182eed:
                          value = pbVar11 + (2 - lVar14);
                          iVar2 = 0;
                          goto LAB_00182ef7;
                        }
                        pxVar6 = xmlNewText((xmlChar *)0x0);
                        if (pxVar6 != (xmlNodePtr)0x0) {
                          pxVar6->doc = doc;
                          pxVar5 = xmlBufDetach(buf);
                          pxVar6->content = pxVar5;
                          pxVar7 = pxVar6;
                          if (local_60 != (xmlNodePtr)0x0) {
                            pxVar7 = xmlAddNextSibling(local_60,pxVar6);
                            pxVar6 = local_70;
                          }
                          goto LAB_00182d9e;
                        }
LAB_00182eb6:
                        if (pxVar8 != (xmlChar *)0x0) {
                          (*xmlFree)(pxVar8);
                        }
                      }
                      else {
                        iVar2 = xmlBufCat(buf,pxVar3->content);
                        pxVar6 = local_70;
                        pxVar7 = local_60;
                        if (iVar2 == 0) goto LAB_00182eda;
                      }
                      goto LAB_00182d7f;
                    }
                  }
LAB_00182d61:
                  __xmlSimpleError(2,0x516,(xmlNodePtr)doc,"unterminated entity reference %15s\n",
                                   (char *)pbVar12);
LAB_00182d7f:
                  bVar15 = false;
                  goto LAB_00182f2a;
                }
                iVar2 = 0;
                bVar1 = 0;
                if (pbVar13 < pbVar10) {
                  bVar1 = *pbVar13;
                }
                bVar15 = bVar1 == 0x3b;
                if (!bVar15) {
                  if ((byte)(bVar1 - 0x30) < 10) {
                    iVar2 = 0;
                    pbVar12 = pbVar11 + 3;
                    do {
                      pbVar13 = pbVar12;
                      if (pbVar13 < pbVar10) {
                        bVar9 = *pbVar13;
                      }
                      else {
                        bVar9 = 0;
                      }
                      iVar2 = (uint)bVar1 + iVar2 * 10 + -0x30;
                      bVar15 = bVar9 == 0x3b;
                      if (bVar15) goto LAB_00182cd2;
                      pbVar12 = pbVar13 + 1;
                      bVar1 = bVar9;
                    } while ((byte)(bVar9 - 0x30) < 10);
                  }
                  iVar2 = 0;
                  __xmlSimpleError(2,0x515,(xmlNodePtr)doc,"invalid decimal character value\n",
                                   (char *)0x0);
                }
LAB_00182cd2:
                value = pbVar13 + bVar15;
              }
LAB_00182ef7:
              pbVar12 = value;
              if (iVar2 != 0) {
                iVar2 = xmlCopyCharMultiByte(local_3a,iVar2);
                local_3a[iVar2] = '\0';
                iVar2 = xmlBufCat(buf,local_3a);
                bVar15 = iVar2 == 0;
                if (!bVar15) goto LAB_00182f2a;
              }
              bVar15 = true;
            }
            else {
              bVar15 = false;
            }
LAB_00182f2a:
            pxVar6 = local_70;
            if (!bVar15) goto LAB_00182ff7;
          }
          else {
            if (*pbVar11 == 0) break;
            value = pbVar11 + 1;
          }
          pbVar11 = value;
        } while (value < pbVar10);
      }
      pxVar6 = local_70;
      if ((value == pbVar12) ||
         (iVar2 = xmlBufAdd(buf,pbVar12,(int)value - (int)pbVar12), iVar2 == 0)) {
        iVar2 = xmlBufIsEmpty(buf);
        if (iVar2 == 0) {
          pxVar7 = xmlNewText((xmlChar *)0x0);
          if (pxVar7 != (xmlNodePtr)0x0) {
            pxVar7->doc = doc;
            pxVar8 = xmlBufDetach(buf);
            pxVar7->content = pxVar8;
            pxVar6 = pxVar7;
            if (local_60 != (xmlNodePtr)0x0) {
              xmlAddNextSibling(local_60,pxVar7);
              pxVar6 = local_70;
            }
          }
        }
        else if ((local_70 == (xmlNodePtr)0x0) &&
                (pxVar6 = xmlNewText(""), pxVar6 != (xmlNodePtr)0x0)) {
          pxVar6->doc = doc;
        }
      }
LAB_00182ff7:
      local_70 = pxVar6;
      xmlBufFree(buf);
    }
  }
  return local_70;
code_r0x00182cfa:
  lVar14 = lVar14 + -1;
  value = value + 1;
  bVar15 = value < pbVar10;
  if (!bVar15) goto LAB_00182d61;
  goto LAB_00182ced;
}

Assistant:

xmlNodePtr
xmlStringLenGetNodeList(const xmlDoc *doc, const xmlChar *value, int len) {
    xmlNodePtr ret = NULL, last = NULL;
    xmlNodePtr node;
    xmlChar *val;
    const xmlChar *cur, *end;
    const xmlChar *q;
    xmlEntityPtr ent;
    xmlBufPtr buf;

    if (value == NULL) return(NULL);
    cur = value;
    end = cur + len;

    buf = xmlBufCreateSize(0);
    if (buf == NULL) return(NULL);
    xmlBufSetAllocationScheme(buf, XML_BUFFER_ALLOC_DOUBLEIT);

    q = cur;
    while ((cur < end) && (*cur != 0)) {
	if (cur[0] == '&') {
	    int charval = 0;
	    xmlChar tmp;

	    /*
	     * Save the current text.
	     */
            if (cur != q) {
		if (xmlBufAdd(buf, q, cur - q))
		    goto out;
	    }
	    q = cur;
	    if ((cur + 2 < end) && (cur[1] == '#') && (cur[2] == 'x')) {
		cur += 3;
		if (cur < end)
		    tmp = *cur;
		else
		    tmp = 0;
		while (tmp != ';') { /* Non input consuming loop */
                    /*
                     * If you find an integer overflow here when fuzzing,
                     * the bug is probably elsewhere. This function should
                     * only receive entities that were already validated by
                     * the parser, typically by xmlParseAttValueComplex
                     * calling xmlStringDecodeEntities.
                     *
                     * So it's better *not* to check for overflow to
                     * potentially discover new bugs.
                     */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 16 + (tmp - '0');
		    else if ((tmp >= 'a') && (tmp <= 'f'))
			charval = charval * 16 + (tmp - 'a') + 10;
		    else if ((tmp >= 'A') && (tmp <= 'F'))
			charval = charval * 16 + (tmp - 'A') + 10;
		    else {
			xmlTreeErr(XML_TREE_INVALID_HEX, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    if (cur < end)
			tmp = *cur;
		    else
			tmp = 0;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else if ((cur + 1 < end) && (cur[1] == '#')) {
		cur += 2;
		if (cur < end)
		    tmp = *cur;
		else
		    tmp = 0;
		while (tmp != ';') { /* Non input consuming loops */
                    /* Don't check for integer overflow, see above. */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 10 + (tmp - '0');
		    else {
			xmlTreeErr(XML_TREE_INVALID_DEC, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    if (cur < end)
			tmp = *cur;
		    else
			tmp = 0;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else {
		/*
		 * Read the entity string
		 */
		cur++;
		q = cur;
		while ((cur < end) && (*cur != 0) && (*cur != ';')) cur++;
		if ((cur >= end) || (*cur == 0)) {
		    xmlTreeErr(XML_TREE_UNTERMINATED_ENTITY, (xmlNodePtr) doc,
		               (const char *) q);
		    goto out;
		}
		if (cur != q) {
		    /*
		     * Predefined entities don't generate nodes
		     */
		    val = xmlStrndup(q, cur - q);
		    ent = xmlGetDocEntity(doc, val);
		    if ((ent != NULL) &&
			(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {

			if (xmlBufCat(buf, ent->content))
			    goto out;

		    } else {
			/*
			 * Flush buffer so far
			 */
			if (!xmlBufIsEmpty(buf)) {
			    node = xmlNewDocText(doc, NULL);
			    if (node == NULL) {
				if (val != NULL) xmlFree(val);
				goto out;
			    }
			    node->content = xmlBufDetach(buf);

			    if (last == NULL) {
				last = ret = node;
			    } else {
				last = xmlAddNextSibling(last, node);
			    }
			}

			/*
			 * Create a new REFERENCE_REF node
			 */
			node = xmlNewReference(doc, val);
			if (node == NULL) {
			    if (val != NULL) xmlFree(val);
			    goto out;
			}
			else if ((ent != NULL) && (ent->children == NULL)) {
			    xmlNodePtr temp;

                            /* Set to non-NULL value to avoid recursion. */
			    ent->children = (xmlNodePtr) -1;
			    ent->children = xmlStringGetNodeList(doc,
				    (const xmlChar*)node->content);
			    ent->owner = 1;
			    temp = ent->children;
			    while (temp) {
				temp->parent = (xmlNodePtr)ent;
				ent->last = temp;
				temp = temp->next;
			    }
			}
			if (last == NULL) {
			    last = ret = node;
			} else {
			    last = xmlAddNextSibling(last, node);
			}
		    }
		    xmlFree(val);
		}
		cur++;
		q = cur;
	    }
	    if (charval != 0) {
		xmlChar buffer[10];
		int l;

		l = xmlCopyCharMultiByte(buffer, charval);
		buffer[l] = 0;

		if (xmlBufCat(buf, buffer))
		    goto out;
		charval = 0;
	    }
	} else
	    cur++;
    }

    if (cur != q) {
        /*
	 * Handle the last piece of text.
	 */
	if (xmlBufAdd(buf, q, cur - q))
	    goto out;
    }

    if (!xmlBufIsEmpty(buf)) {
	node = xmlNewDocText(doc, NULL);
	if (node == NULL) goto out;
	node->content = xmlBufDetach(buf);

	if (last == NULL) {
	    ret = node;
	} else {
	    xmlAddNextSibling(last, node);
	}
    } else if (ret == NULL) {
        ret = xmlNewDocText(doc, BAD_CAST "");
    }

out:
    xmlBufFree(buf);
    return(ret);
}